

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

void __thiscall
Lodtalk::AST::MethodAST::MethodAST
          (MethodAST *this,VMContext *context,MethodHeader *header,PragmaList *pragmaList,
          SequenceNode *body)

{
  (this->super_FunctionalNode).localVariables.
  super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_FunctionalNode).localVariables.
  super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_FunctionalNode).localVariables.
  super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_FunctionalNode).super_Node._vptr_Node = (_func_int **)&PTR__MethodAST_001641c0;
  this->context = context;
  this->header = header;
  this->pragmaList = pragmaList;
  this->body = body;
  (this->astHandle).reference.oop.field_0.pointer = (uint8_t *)&NilObject;
  (this->astHandle).reference.context_ = context;
  OopRef::registerSelf(&(this->astHandle).reference);
  return;
}

Assistant:

MethodAST::MethodAST(VMContext *context, MethodHeader *header, PragmaList *pragmaList, SequenceNode *body)
	: context(context), header(header), pragmaList(pragmaList), body(body), astHandle(context)
{
}